

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

int __thiscall
icu_63::DecimalFormat::clone
          (DecimalFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DecimalFormat *this_00;
  
  this_00 = (DecimalFormat *)UMemory::operator_new((UMemory *)0x170,(size_t)__fn);
  if (this_00 == (DecimalFormat *)0x0) {
    this_00 = (DecimalFormat *)0x0;
  }
  else {
    DecimalFormat(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Format* DecimalFormat::clone() const {
    return new DecimalFormat(*this);
}